

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O0

void __thiscall prometheus::Histogram::Histogram(Histogram *this,BucketBoundaries *buckets)

{
  bool bVar1;
  size_type sVar2;
  iterator first;
  iterator last;
  invalid_argument *this_00;
  allocator<prometheus::Counter> local_19;
  BucketBoundaries *local_18;
  BucketBoundaries *buckets_local;
  Histogram *this_local;
  
  local_18 = buckets;
  buckets_local = &this->bucket_boundaries_;
  std::vector<double,_std::allocator<double>_>::vector(&this->bucket_boundaries_,buckets);
  std::mutex::mutex(&this->mutex_);
  sVar2 = std::vector<double,_std::allocator<double>_>::size(&this->bucket_boundaries_);
  std::allocator<prometheus::Counter>::allocator(&local_19);
  std::vector<prometheus::Counter,_std::allocator<prometheus::Counter>_>::vector
            (&this->bucket_counts_,sVar2 + 1,&local_19);
  std::allocator<prometheus::Counter>::~allocator(&local_19);
  Gauge::Gauge(&this->sum_);
  first = std::begin<std::vector<double,std::allocator<double>>>(&this->bucket_boundaries_);
  last = std::end<std::vector<double,std::allocator<double>>>(&this->bucket_boundaries_);
  bVar1 = (anonymous_namespace)::
          is_strict_sorted<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     first._M_current,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     last._M_current);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Bucket Boundaries must be strictly sorted");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Histogram::Histogram(BucketBoundaries&& buckets)
    : bucket_boundaries_{std::move(buckets)},
      bucket_counts_{bucket_boundaries_.size() + 1} {
  if (!is_strict_sorted(begin(bucket_boundaries_), end(bucket_boundaries_))) {
    throw std::invalid_argument("Bucket Boundaries must be strictly sorted");
  }
}